

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::unreadToken(Analyser *this)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  uint64_t uVar3;
  Analyser *this_local;
  
  if (this->_offset != 0) {
    uVar1 = this->_offset;
    sVar2 = std::vector<Token,_std::allocator<Token>_>::size(&this->_tokens);
    if (uVar1 < sVar2) {
      this_00 = std::vector<Token,_std::allocator<Token>_>::operator[]
                          (&this->_tokens,this->_offset - 1);
      uVar3 = Token::GetLine(this_00);
      this->_currentLine = (int32_t)uVar3;
      this->_offset = this->_offset - 1;
    }
    else {
      this->_offset = this->_offset - 1;
    }
  }
  return;
}

Assistant:

void Analyser::unreadToken() {
	if (_offset == 0) {
		return;
	}
	if (_offset >= _tokens.size()) {
		_offset--;
		return;
	}
	_currentLine = _tokens[_offset - 1].GetLine();
	_offset--;
}